

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,char *fileName,Header *header,int numThreads)

{
  _func_int **pp_Var1;
  DeepScanLineOutputFile *this_00;
  Header *header_00;
  OStream *os;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  _func_int *p_Var2;
  GenericOutputFile *in_RDI;
  undefined1 unaff_retaddr;
  OStream *in_stack_00000008;
  Header *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_00001a5e;
  undefined1 in_stack_00001a5f;
  Header *in_stack_00001a60;
  OutputStreamMutex *in_stack_fffffffffffffdc0;
  OStream *in_stack_fffffffffffffdc8;
  GenericOutputFile *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffde8;
  StdOFStream *in_stack_fffffffffffffdf0;
  Data *in_stack_fffffffffffffe40;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__DeepScanLineOutputFile_002ac1f8;
  pp_Var1 = (_func_int **)operator_new(0x180);
  Data::Data(in_stack_fffffffffffffe40,(int)((ulong)pp_Var1 >> 0x20));
  in_RDI[1]._vptr_GenericOutputFile = pp_Var1;
  this_00 = (DeepScanLineOutputFile *)operator_new(0x38);
  this_00[2].super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  this_00[2]._data = (Data *)0x0;
  this_00[1].super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  this_00[1]._data = (Data *)0x0;
  (this_00->super_GenericOutputFile)._vptr_GenericOutputFile = (_func_int **)0x0;
  this_00->_data = (Data *)0x0;
  this_00[3].super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdc0);
  in_RDI[1]._vptr_GenericOutputFile[0x2e] = (_func_int *)this_00;
  *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x2f) = 1;
  Header::sanityCheck(in_stack_00001a60,(bool)in_stack_00001a5f,(bool)in_stack_00001a5e);
  header_00 = (Header *)operator_new(0x38);
  StdOFStream::StdOFStream(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  *(Header **)(in_RDI[1]._vptr_GenericOutputFile[0x2e] + 0x28) = header_00;
  initialize(this_00,header_00);
  os = (OStream *)
       (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x2e] + 0x28) + 0x18))();
  *(OStream **)(in_RDI[1]._vptr_GenericOutputFile[0x2e] + 0x30) = os;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Header *)in_stack_fffffffffffffdc0
            );
  lineOffsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                Header::writeTo(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  in_RDI[1]._vptr_GenericOutputFile[8] = (_func_int *)lineOffsets;
  p_Var2 = (_func_int *)anon_unknown_6::writeLineOffsets(os,lineOffsets);
  in_RDI[1]._vptr_GenericOutputFile[0x24] = p_Var2;
  *(undefined1 *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x3c) = 0;
  return;
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile (
    const char fileName[], const Header& header, int numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = true;
    try
    {
        header.sanityCheck ();
        _data->_streamData->os = new StdOFStream (fileName);
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (
            *_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
            writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
        _data->multipart = false; // not multipart; only one header
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data->_streamData->os;
        delete _data->_streamData;
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << fileName
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data->_streamData->os;
        delete _data->_streamData;
        delete _data;
        throw;
    }
}